

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flying_cheat.cc
# Opt level: O1

void __thiscall FlyingCheat::disable(FlyingCheat *this)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  
  LOCK();
  (this->super_Cheat).active._M_base._M_i = false;
  UNLOCK();
  plVar2 = (long *)dlsym(0xffffffffffffffff,"GameWorld");
  if (*plVar2 == 0) {
    pcVar5 = "Couldn\'t locate \'GameWorld\' symbol";
    lVar4 = 0x22;
    poVar3 = (ostream *)&std::cerr;
  }
  else {
    lVar1 = *(long *)(*plVar2 + 0xd8);
    lVar4 = lVar1 + -0xa8;
    if (lVar1 == 0) {
      lVar4 = 0;
    }
    *(float *)(lVar4 + 0x2e4) = this->m_jumpSpeed;
    *(float *)(lVar4 + 0x2e8) = this->m_jumpHoldTime;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,module_name_abi_cxx11_._M_dataplus._M_p,
                        module_name_abi_cxx11_._M_string_length);
    pcVar5 = " disabled";
    lVar4 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void FlyingCheat::disable()
{
    this->active = false;
    // Get the game world object
    ClientWorld *world = *((ClientWorld**)(dlsym(RTLD_NEXT, "GameWorld")));
    if (world == NULL) {
        std::cerr << "Couldn't locate 'GameWorld' symbol" << std::endl;
        return;
    }

    // Reset
    Player *player = (Player *)(world->m_activePlayer.m_object); 
    player->m_jumpSpeed = this->m_jumpSpeed;
    player->m_jumpHoldTime = this->m_jumpHoldTime;

    std::cout << module_name << " disabled" << std::endl;
}